

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_expression_scan.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalExpressionScan::Execute
          (PhysicalExpressionScan *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state_p)

{
  _func_int **pp_Var1;
  bool bVar2;
  
  pp_Var1 = state_p[1]._vptr_OperatorState;
  if (input->count + chunk->count < 0x801) {
    do {
      if ((_func_int **)
          (((long)(this->expressions).
                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->expressions).
                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <= pp_Var1)
      break;
      DataChunk::Reset((DataChunk *)(state_p + 2));
      EvaluateExpression(this,context->client,(idx_t)state_p[1]._vptr_OperatorState,
                         (optional_ptr<duckdb::DataChunk,_true>)input,chunk,
                         (DataChunk *)(state_p + 2));
      pp_Var1 = (_func_int **)((long)state_p[1]._vptr_OperatorState + 1);
      state_p[1]._vptr_OperatorState = pp_Var1;
    } while (input->count + chunk->count < 0x801);
  }
  bVar2 = pp_Var1 < (_func_int **)
                    (((long)(this->expressions).
                            super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            .
                            super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->expressions).
                            super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            .
                            super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if (!bVar2) {
    state_p[1]._vptr_OperatorState = (_func_int **)0x0;
  }
  return bVar2;
}

Assistant:

OperatorResultType PhysicalExpressionScan::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   GlobalOperatorState &gstate, OperatorState &state_p) const {
	auto &state = state_p.Cast<ExpressionScanState>();

	for (; chunk.size() + input.size() <= STANDARD_VECTOR_SIZE && state.expression_index < expressions.size();
	     state.expression_index++) {
		state.temp_chunk.Reset();
		EvaluateExpression(context.client, state.expression_index, &input, chunk, &state.temp_chunk);
	}
	if (state.expression_index < expressions.size()) {
		return OperatorResultType::HAVE_MORE_OUTPUT;
	} else {
		state.expression_index = 0;
		return OperatorResultType::NEED_MORE_INPUT;
	}
}